

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

void __thiscall ON_3dmConstructionPlane::ON_3dmConstructionPlane(ON_3dmConstructionPlane *this)

{
  long lVar1;
  ON_Plane *pOVar2;
  ON_3dmConstructionPlane *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  ON_Plane::ON_Plane(&this->m_plane);
  ON_wString::ON_wString(&this->m_name);
  ON_wString::Destroy(&this->m_name);
  pOVar2 = &ON_xy_plane;
  pOVar3 = this;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar3->m_plane).origin.x = (pOVar2->origin).x;
    pOVar2 = (ON_Plane *)((long)pOVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pOVar3 = (ON_3dmConstructionPlane *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  this->m_grid_spacing = 1.0;
  this->m_snap_spacing = 1.0;
  this->m_grid_line_count = 0x46;
  this->m_grid_thick_frequency = 5;
  this->m_bDepthBuffer = true;
  return;
}

Assistant:

ON_3dmConstructionPlane::ON_3dmConstructionPlane()
{
  Default();
}